

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTPNCommaBase::fold_binop(CTPNCommaBase *this)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pCVar1 = (this->super_CTPNBin).super_CTPNBinBase.left_;
  pCVar2 = (this->super_CTPNBin).super_CTPNBinBase.right_;
  iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar1);
  if ((CONCAT44(extraout_var,iVar3) != 0) &&
     (iVar3 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar2),
     CONCAT44(extraout_var_00,iVar3) != 0)) {
    return pCVar2;
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTPNCommaBase::fold_binop()
{
    /* use the normal addition folder */
    return S_op_comma.eval_constant(left_, right_);
}